

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shared_alloc.hpp
# Opt level: O1

promoted_t<double> Omega_h::get_sum<double>(Read<double> *a)

{
  Alloc *pAVar1;
  ulong uVar2;
  long lVar3;
  double dVar4;
  
  pAVar1 = (a->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  entering_parallel = 0;
  dVar4 = 0.0;
  if ((uVar2 >> 3 & 0xffffffff) != 0) {
    lVar3 = 0;
    do {
      dVar4 = dVar4 + *(double *)((long)(a->write_).shared_alloc_.direct_ptr + lVar3);
      lVar3 = lVar3 + 8;
    } while ((long)(int)(uVar2 >> 3) * 8 != lVar3);
  }
  return dVar4;
}

Assistant:

const noexcept {
#ifndef __CUDA_ARCH__
    if (!(reinterpret_cast<std::uintptr_t>(alloc) & IN_PARALLEL)) {
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wnull-dereference"
#endif
      return alloc->size;
#if defined(__GNUC__) && (__GNUC__ >= 7) && (!defined(__clang__))
#pragma GCC diagnostic pop
#endif
    }
#endif
    return reinterpret_cast<std::uintptr_t>(alloc) >> 3;
  }